

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void destroy_all_streams(quicly_conn_t *conn,int err,int including_crypto_streams)

{
  uint32_t uVar1;
  int in_EDX;
  quicly_conn_t *in_RDI;
  quicly_stream_t *unaff_retaddr;
  khint_t __i;
  quicly_stream_t *stream;
  uint local_1c;
  
  for (local_1c = 0; local_1c != in_RDI->streams->n_buckets; local_1c = local_1c + 1) {
    if (((in_RDI->streams->flags[local_1c >> 4] >> (sbyte)((local_1c & 0xf) << 1) & 3) == 0) &&
       ((in_EDX != 0 || (-1 < in_RDI->streams->vals[local_1c]->stream_id)))) {
      destroy_stream(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    }
  }
  uVar1 = quicly_num_streams(in_RDI);
  if (uVar1 != 0) {
    __assert_fail("quicly_num_streams(conn) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x483,"void destroy_all_streams(quicly_conn_t *, int, int)");
  }
  return;
}

Assistant:

static void destroy_all_streams(quicly_conn_t *conn, int err, int including_crypto_streams)
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        /* TODO do we need to send reset signals to open streams? */
        if (including_crypto_streams || stream->stream_id >= 0)
            destroy_stream(stream, err);
    });
    assert(quicly_num_streams(conn) == 0);
}